

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator.cpp
# Opt level: O2

void __thiscall
dominator::dfs(dominator *this,BasicBlock *bb,
              set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_> *visited,
              int *id)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *plVar5;
  BasicBlock *_bb;
  BasicBlock *local_40;
  BasicBlock *local_38;
  
  local_38 = bb;
  std::
  _Rb_tree<BasicBlock*,BasicBlock*,std::_Identity<BasicBlock*>,std::less<BasicBlock*>,std::allocator<BasicBlock*>>
  ::_M_insert_unique<BasicBlock*const&>
            ((_Rb_tree<BasicBlock*,BasicBlock*,std::_Identity<BasicBlock*>,std::less<BasicBlock*>,std::allocator<BasicBlock*>>
              *)visited,&local_38);
  plVar5 = &local_38->succ_bbs_;
  p_Var4 = (_List_node_base *)plVar5;
  while (p_Var4 = (((_List_base<BasicBlock_*,_std::allocator<BasicBlock_*>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar5) {
    local_40 = (BasicBlock *)p_Var4[1]._M_next;
    if (local_40->_fake == false) {
      iVar2 = std::
              _Rb_tree<BasicBlock_*,_BasicBlock_*,_std::_Identity<BasicBlock_*>,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_>
              ::find(&visited->_M_t,&local_40);
      if ((_Rb_tree_header *)iVar2._M_node == &(visited->_M_t)._M_impl.super__Rb_tree_header) {
        dfs(this,local_40,visited,id);
      }
    }
  }
  iVar1 = *id;
  *id = iVar1 + 1;
  pmVar3 = std::
           map<BasicBlock_*,_int,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_int>_>_>
           ::operator[](&this->_postOrderID,&local_38);
  *pmVar3 = iVar1;
  std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::push_back
            (&this->_reversedPostOrderQueue,&local_38);
  return;
}

Assistant:

void dominator::dfs(BasicBlock *bb, std::set<BasicBlock *> &visited, int &id){
    visited.insert(bb);
    for (auto _bb : bb->get_succ_basic_blocks()) {
        // 跳过假块
        if(_bb->is_fake_block()) continue;
        // 若没有访问过则对其访问，否则跳过
        if (visited.find(_bb) == visited.end()) {
            dfs(_bb, visited, id);
        }
    }
    _postOrderID[bb] = id++;
    _reversedPostOrderQueue.push_back(bb);
}